

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void __thiscall
Importer_isResolvedComponentOverTwoLevels_Test::~Importer_isResolvedComponentOverTwoLevels_Test
          (Importer_isResolvedComponentOverTwoLevels_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, isResolvedComponentOverTwoLevels)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/component_importer.cellml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(2), importer->libraryCount());

    auto component = model->component(0);

    EXPECT_TRUE(component->isResolved());

    EXPECT_FALSE(model->hasUnresolvedImports());
}